

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

bool __thiscall
soplex::SPxMainSM<double>::PostStep::checkBasisDim
          (PostStep *this,DataArray<soplex::SPxSolverBase<double>::VarStatus> *rows,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cols)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = this->nRows;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  uVar2 = 0;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    uVar2 = uVar2 + (rows->data[uVar3] == BASIC);
  }
  uVar4 = 0;
  uVar3 = (ulong)(uint)this->nCols;
  if (this->nCols < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    uVar2 = uVar2 + (cols->data[uVar4] == BASIC);
  }
  return uVar2 == uVar1;
}

Assistant:

bool SPxMainSM<R>::PostStep::checkBasisDim(DataArray<typename SPxSolverBase<R>::VarStatus> rows,
      DataArray<typename SPxSolverBase<R>::VarStatus> cols) const
{
   int numBasis = 0;

   for(int rs = 0; rs < nRows; ++rs)
   {
      if(rows[rs] == SPxSolverBase<R>::BASIC)
         numBasis++;
   }

   for(int cs = 0; cs < nCols; ++cs)
   {
      if(cols[cs] == SPxSolverBase<R>::BASIC)
         numBasis++;
   }

   assert(numBasis == nRows);
   return numBasis == nRows;
}